

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O3

void __thiscall
ktx::CommandCompare::compareHeader(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  uint uVar1;
  pointer pKVar2;
  pointer pKVar3;
  CommandCompare *pCVar4;
  ktx_uint64_t kVar5;
  undefined8 uVar6;
  string_view what;
  string_view textHeaderIn;
  string_view jsonPathIn;
  undefined1 local_b8 [32];
  char *local_98;
  undefined1 local_90 [12];
  undefined1 auStack_84 [4];
  _Storage<unsigned_long,_true> _Stack_80;
  undefined1 uStack_78;
  bool local_77;
  bool local_76;
  undefined5 uStack_75;
  char *local_70;
  ktx_uint32_t local_68;
  ktx_uint32_t local_64;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  
  local_b8._0_8_ = (pointer)(local_b8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Header\n\n","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&diff->context,
                    (diff->context).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&diff->context,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
  }
  what._M_str = "header";
  what._M_len = 6;
  read<KTX_header2>((vector<KTX_header2,_std::allocator<KTX_header2>_> *)local_b8,this,streams,0,
                    what);
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  pKVar3 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_b8._0_8_;
  (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_b8._8_8_;
  (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._16_8_;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  local_b8._16_8_ = 0;
  if (pKVar2 != (pointer)0x0) {
    operator_delete(pKVar2,(long)pKVar3 - (long)pKVar2);
    if ((pointer)local_b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
    }
  }
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_90._0_8_ = *(undefined8 *)pKVar2->identifier;
  local_90._8_4_ = *(undefined4 *)(pKVar2->identifier + 8);
  local_60._8_4_ = local_90._8_4_;
  pCVar4 = *(CommandCompare **)pKVar2[1].identifier;
  unique0x00011f80 = *(undefined4 *)(pKVar2[1].identifier + 8);
  local_b8._8_8_ = (pointer)0xa;
  local_b8._16_8_ = (long)"/header/identifier" + 8;
  local_b8._24_8_ = 0x12;
  local_98 = "/header/identifier";
  local_76 = local_90._8_4_ != unique0x00011f80 || (CommandCompare *)local_90._0_8_ != pCVar4;
  auStack_84._1_3_ = SUB83(pCVar4,0);
  auStack_84[0] = true;
  _Stack_80._M_value._0_1_ = (undefined1)((ulong)pCVar4 >> 0x18);
  _Stack_80._M_value._1_4_ = (undefined4)((ulong)pCVar4 >> 0x20);
  local_77 = true;
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025bc50;
  local_60._M_unused._0_8_ = local_90._0_8_;
  PrintDiff::operator<<(diff,(DiffBase<std::array<unsigned_char,_12UL>_> *)local_b8);
  if ((this->options).super_OptionsCompare.ignoreFormatHeader == false) {
    pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_64 = pKVar2->vkFormat;
    local_68 = pKVar2[1].vkFormat;
    local_60._8_8_ = 0;
    local_48 = std::
               _Function_handler<const_char_*(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1465:13)>
               ::_M_invoke;
    local_50 = std::
               _Function_handler<const_char_*(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1465:13)>
               ::_M_manager;
    textHeaderIn._M_str = "vkFormat";
    textHeaderIn._M_len = 8;
    jsonPathIn._M_str = "/header/vkFormat";
    jsonPathIn._M_len = 0x10;
    local_60._M_unused._M_object = this;
    DiffEnum<VkFormat>::DiffEnum
              ((DiffEnum<VkFormat> *)local_b8,textHeaderIn,jsonPathIn,(int32_t *)&local_64,
               (int32_t *)&local_68,(function<const_char_*(unsigned_long)> *)&local_60);
    PrintDiff::operator<<(diff,(DiffBase<VkFormat> *)local_b8);
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
    pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x8;
    local_b8._16_8_ = (long)"/header/typeSize" + 8;
    local_b8._24_8_ = 0x10;
    local_98 = "/header/typeSize";
    uVar1 = pKVar2->typeSize;
    local_90._8_4_ = pKVar2[1].typeSize;
    _Stack_80._M_value._0_1_ = uVar1 != local_90._8_4_;
    local_90._0_8_ = (ulong)uVar1 | 0x100000000;
    auStack_84 = (undefined1  [4])0x1;
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025c368;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  }
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8._8_8_ = (pointer)0xa;
  local_b8._16_8_ = (long)"/header/pixelWidth" + 8;
  local_b8._24_8_ = 0x12;
  local_98 = "/header/pixelWidth";
  uVar1 = pKVar2->pixelWidth;
  local_90._8_4_ = pKVar2[1].pixelWidth;
  _Stack_80._M_value._0_1_ = uVar1 != local_90._8_4_;
  local_90._0_8_ = (ulong)uVar1 | 0x100000000;
  auStack_84 = (undefined1  [4])0x1;
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025c368;
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8._8_8_ = (pointer)0xb;
  local_b8._16_8_ = (long)"/header/pixelHeight" + 8;
  local_b8._24_8_ = 0x13;
  local_98 = "/header/pixelHeight";
  uVar1 = pKVar2->pixelHeight;
  local_90._8_4_ = pKVar2[1].pixelHeight;
  _Stack_80._M_value._0_1_ = uVar1 != local_90._8_4_;
  local_90._0_8_ = (ulong)uVar1 | 0x100000000;
  auStack_84 = (undefined1  [4])0x1;
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025c368;
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8._8_8_ = (pointer)0xa;
  local_b8._16_8_ = (long)"/header/pixelDepth" + 8;
  local_b8._24_8_ = 0x12;
  local_98 = "/header/pixelDepth";
  uVar1 = pKVar2->pixelDepth;
  local_90._8_4_ = pKVar2[1].pixelDepth;
  _Stack_80._M_value._0_1_ = uVar1 != local_90._8_4_;
  local_90._0_8_ = (ulong)uVar1 | 0x100000000;
  auStack_84 = (undefined1  [4])0x1;
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025c368;
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8._8_8_ = (pointer)0xa;
  local_b8._16_8_ = (long)"/header/layerCount" + 8;
  local_b8._24_8_ = 0x12;
  local_98 = "/header/layerCount";
  uVar1 = pKVar2->layerCount;
  local_90._8_4_ = pKVar2[1].layerCount;
  _Stack_80._M_value._0_1_ = uVar1 != local_90._8_4_;
  local_90._0_8_ = (ulong)uVar1 | 0x100000000;
  auStack_84 = (undefined1  [4])0x1;
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025c368;
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8._8_8_ = (pointer)0x9;
  local_b8._16_8_ = (long)"/header/faceCount" + 8;
  local_b8._24_8_ = 0x11;
  local_98 = "/header/faceCount";
  uVar1 = pKVar2->faceCount;
  local_90._8_4_ = pKVar2[1].faceCount;
  _Stack_80._M_value._0_1_ = uVar1 != local_90._8_4_;
  local_90._0_8_ = (ulong)uVar1 | 0x100000000;
  auStack_84 = (undefined1  [4])0x1;
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025c368;
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8._8_8_ = (pointer)0xa;
  local_b8._16_8_ = (long)"/header/levelCount" + 8;
  local_b8._24_8_ = 0x12;
  local_98 = "/header/levelCount";
  uVar1 = pKVar2->levelCount;
  local_90._8_4_ = pKVar2[1].levelCount;
  _Stack_80._M_value._0_1_ = uVar1 != local_90._8_4_;
  local_90._0_8_ = (ulong)uVar1 | 0x100000000;
  auStack_84 = (undefined1  [4])0x1;
  local_b8._0_8_ = &PTR_value_abi_cxx11__0025c368;
  PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
  if ((this->options).super_OptionsCompare.ignoreSupercomp == false) {
    pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_90._8_4_ = pKVar2[1].supercompressionScheme;
    local_b8._8_8_ = (pointer)0x16;
    local_b8._16_8_ = (long)"/header/supercompressionScheme" + 8;
    local_b8._24_8_ = 0x1e;
    local_98 = "/header/supercompressionScheme";
    _Stack_80._M_value._0_1_ = pKVar2->supercompressionScheme != local_90._8_4_;
    local_90._0_8_ = (ulong)pKVar2->supercompressionScheme | 0x100000000;
    auStack_84 = (undefined1  [4])0x1;
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025bc90;
    uVar6 = ktxSupercompressionSchemeString();
    uStack_78 = (undefined1)uVar6;
    local_77 = SUB81((ulong)uVar6 >> 8,0);
    local_76 = SUB81((ulong)uVar6 >> 0x10,0);
    uStack_75 = (undefined5)((ulong)uVar6 >> 0x18);
    local_70 = (char *)ktxSupercompressionSchemeString(pKVar2[1].supercompressionScheme);
    PrintDiff::operator<<(diff,(DiffBase<ktxSupercmpScheme> *)local_b8);
  }
  if ((this->options).super_OptionsCompare.ignoreIndex != all) {
    pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x1f;
    local_b8._16_8_ = "dataFormatDescriptor.byteOffset";
    local_b8._24_8_ = 0x26;
    local_98 = "/index/dataFormatDescriptor/byteOffset";
    uVar1 = (pKVar2->dataFormatDescriptor).byteOffset;
    local_90._8_4_ = pKVar2[1].dataFormatDescriptor.byteOffset;
    _Stack_80._M_value._0_1_ = uVar1 != local_90._8_4_;
    local_90._0_8_ = (ulong)uVar1 | 0x100000000;
    auStack_84 = (undefined1  [4])0x1;
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025c398;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
    pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x1f;
    local_b8._16_8_ = "dataFormatDescriptor.byteLength";
    local_b8._24_8_ = 0x26;
    local_98 = "/index/dataFormatDescriptor/byteLength";
    uVar1 = (pKVar2->dataFormatDescriptor).byteLength;
    local_90._8_4_ = pKVar2[1].dataFormatDescriptor.byteLength;
    _Stack_80._M_value._0_1_ = uVar1 != local_90._8_4_;
    local_90._0_8_ = (ulong)uVar1 | 0x100000000;
    auStack_84 = (undefined1  [4])0x1;
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025c368;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
    pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x17;
    local_b8._16_8_ = "keyValueData.byteOffset";
    local_b8._24_8_ = 0x1e;
    local_98 = "/index/keyValueData/byteOffset";
    uVar1 = (pKVar2->keyValueData).byteOffset;
    local_90._8_4_ = pKVar2[1].keyValueData.byteOffset;
    _Stack_80._M_value._0_1_ = uVar1 != local_90._8_4_;
    local_90._0_8_ = (ulong)uVar1 | 0x100000000;
    auStack_84 = (undefined1  [4])0x1;
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025c398;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
    pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x17;
    local_b8._16_8_ = "keyValueData.byteLength";
    local_b8._24_8_ = 0x1e;
    local_98 = "/index/keyValueData/byteLength";
    uVar1 = (pKVar2->keyValueData).byteLength;
    local_90._8_4_ = pKVar2[1].keyValueData.byteLength;
    _Stack_80._M_value._0_1_ = uVar1 != local_90._8_4_;
    local_90._0_8_ = (ulong)uVar1 | 0x100000000;
    auStack_84 = (undefined1  [4])0x1;
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025c368;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_b8);
    pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x25;
    local_b8._16_8_ = "supercompressionGlobalData.byteOffset";
    local_b8._24_8_ = 0x2c;
    local_98 = "/index/supercompressionGlobalData/byteOffset";
    local_90._0_8_ = (pKVar2->supercompressionGlobalData).byteOffset;
    kVar5 = pKVar2[1].supercompressionGlobalData.byteOffset;
    local_90[8] = '\x01';
    _Stack_80._M_value._0_1_ = (undefined1)kVar5;
    _Stack_80._M_value._1_4_ = (undefined4)(kVar5 >> 8);
    _Stack_80._M_value._5_3_ = (undefined3)(kVar5 >> 0x28);
    uStack_78 = 1;
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025c3c8;
    local_70._0_1_ = local_90._0_8_ != kVar5;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_long> *)local_b8);
    pKVar2 = (this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_b8._8_8_ = (pointer)0x25;
    local_b8._16_8_ = "supercompressionGlobalData.byteLength";
    local_b8._24_8_ = 0x2c;
    local_98 = "/index/supercompressionGlobalData/byteLength";
    local_90._0_8_ = (pKVar2->supercompressionGlobalData).byteLength;
    kVar5 = pKVar2[1].supercompressionGlobalData.byteLength;
    local_70 = (char *)CONCAT71(local_70._1_7_,local_90._0_8_ != kVar5);
    local_90[8] = 1;
    _Stack_80._M_value._0_1_ = (undefined1)kVar5;
    _Stack_80._M_value._1_4_ = (undefined4)(kVar5 >> 8);
    _Stack_80._M_value._5_3_ = (undefined3)(kVar5 >> 0x28);
    uStack_78 = 1;
    local_b8._0_8_ = &PTR_value_abi_cxx11__0025c408;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_long> *)local_b8);
  }
  return;
}

Assistant:

void CommandCompare::compareHeader(PrintDiff& diff, InputStreams& streams) {
    diff.setContext("Header\n\n");

    headers = read<KTX_header2>(streams, 0, "header");

    diff << DiffIdentifier("identifier", "/header/identifier", headers[0], headers[1]);

    if (!options.ignoreFormatHeader) {
        diff << DiffEnum<VkFormat>("vkFormat", "/header/vkFormat", headers[0].vkFormat, headers[1].vkFormat,
            [&](auto i) { return vkFormatString(VkFormat(headers[i].vkFormat)); });
        diff << Diff("typeSize", "/header/typeSize", headers[0].typeSize, headers[1].typeSize);
    }

    diff << Diff("pixelWidth", "/header/pixelWidth", headers[0].pixelWidth, headers[1].pixelWidth);
    diff << Diff("pixelHeight", "/header/pixelHeight", headers[0].pixelHeight, headers[1].pixelHeight);
    diff << Diff("pixelDepth", "/header/pixelDepth", headers[0].pixelDepth, headers[1].pixelDepth);
    diff << Diff("layerCount", "/header/layerCount", headers[0].layerCount, headers[1].layerCount);
    diff << Diff("faceCount", "/header/faceCount", headers[0].faceCount, headers[1].faceCount);
    diff << Diff("levelCount", "/header/levelCount", headers[0].levelCount, headers[1].levelCount);

    if (!options.ignoreSupercomp)
        diff << DiffEnum<ktxSupercmpScheme>("supercompressionScheme", "/header/supercompressionScheme",
            headers[0].supercompressionScheme, headers[1].supercompressionScheme);

    if (options.ignoreIndex != IgnoreIndex::all) {
        diff << DiffHex("dataFormatDescriptor.byteOffset", "/index/dataFormatDescriptor/byteOffset",
            headers[0].dataFormatDescriptor.byteOffset, headers[1].dataFormatDescriptor.byteOffset);
        diff << Diff("dataFormatDescriptor.byteLength", "/index/dataFormatDescriptor/byteLength",
            headers[0].dataFormatDescriptor.byteLength, headers[1].dataFormatDescriptor.byteLength);

        diff << DiffHex("keyValueData.byteOffset", "/index/keyValueData/byteOffset",
            headers[0].keyValueData.byteOffset, headers[1].keyValueData.byteOffset);
        diff << Diff("keyValueData.byteLength", "/index/keyValueData/byteLength",
            headers[0].keyValueData.byteLength, headers[1].keyValueData.byteLength);

        diff << DiffHex("supercompressionGlobalData.byteOffset", "/index/supercompressionGlobalData/byteOffset",
            headers[0].supercompressionGlobalData.byteOffset, headers[1].supercompressionGlobalData.byteOffset);
        diff << Diff("supercompressionGlobalData.byteLength", "/index/supercompressionGlobalData/byteLength",
            headers[0].supercompressionGlobalData.byteLength, headers[1].supercompressionGlobalData.byteLength);
    }
}